

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.cpp
# Opt level: O2

string * __thiscall
MinVR::VRDisplayNode::printNode
          (string *__return_storage_ptr__,VRDisplayNode *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *valuesSet,string *prefix)

{
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar1;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *plVar2;
  VRDisplayNode *this_00;
  iterator iVar3;
  _List_node_base *p_Var4;
  pointer ppVVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  VRDisplayNode *local_100;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_f8;
  string newPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  _Base_ptr local_a8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  local_100 = this;
  local_f8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)valuesSet;
  if ((this->_name)._M_string_length < 0x31) {
    std::__cxx11::string::_M_assign((string *)&name);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_140,(ulong)&this->_name);
    std::operator+(&local_120,&local_140,"...");
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)&this->_name);
    std::operator+(&newPrefix,&local_120,&local_c8);
    std::__cxx11::string::operator=((string *)&name,(string *)&newPrefix);
    std::__cxx11::string::~string((string *)&newPrefix);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (prefix->_M_string_length != 0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  std::operator+(&local_140,prefix,"<displayNode:");
  std::operator+(&local_120,&local_140,&name);
  std::operator+(&newPrefix,&local_120,">");
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&newPrefix);
  std::__cxx11::string::~string((string *)&newPrefix);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::operator+(&newPrefix,prefix," | ");
  std::operator+(&local_c8,"\n",&newPrefix);
  std::operator+(&local_140,&local_c8,"  Type: ");
  (*local_100->_vptr_VRDisplayNode[3])(&local_80);
  std::operator+(&local_120,&local_140,&local_80);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_c8);
  std::operator+(&local_140,"\n",&newPrefix);
  std::operator+(&local_120,&local_140,"  Values Added:");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  plVar1 = &local_100->_valuesAdded;
  p_Var4 = (_List_node_base *)plVar1;
  while (p_Var4 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar1) {
    std::operator+(&local_c8,"\n",&newPrefix);
    std::operator+(&local_140,&local_c8,"    ");
    std::operator+(&local_120,&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1)
                  );
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_c8);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              (local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (p_Var4 + 1));
  }
  if ((plVar1->
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)plVar1) {
    std::operator+(&local_140,"\n",&newPrefix);
    std::operator+(&local_120,&local_140,"     <none>");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
  }
  std::operator+(&local_140,"\n",&newPrefix);
  std::operator+(&local_120,&local_140,"  Values Needed:");
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  plVar2 = &local_100->_valuesNeeded;
  local_a8 = (_Base_ptr)(local_f8 + 8);
  p_Var4 = (_List_node_base *)plVar2;
  while (p_Var4 = (((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != (_List_node_base *)plVar2) {
    std::operator+(&local_c8,"\n",&newPrefix);
    std::operator+(&local_140,&local_c8,"    ");
    std::operator+(&local_120,&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1)
                  );
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1)
                  );
    if (iVar3._M_node == local_a8) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  if ((plVar2->
      super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)plVar2) {
    std::operator+(&local_140,"\n",&newPrefix);
    std::operator+(&local_120,&local_140,"     <none>");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
  }
  for (ppVVar5 = (local_100->_children).
                 super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppVVar5 !=
      (local_100->_children).
      super__Vector_base<MinVR::VRDisplayNode_*,_std::allocator<MinVR::VRDisplayNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppVVar5 = ppVVar5 + 1) {
    this_00 = *ppVVar5;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_60,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f8);
    printNode(&local_140,this_00,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_60,&newPrefix);
    std::operator+(&local_120,"\n",&local_140);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  std::__cxx11::string::~string((string *)&newPrefix);
  std::__cxx11::string::~string((string *)&name);
  return __return_storage_ptr__;
}

Assistant:

std::string VRDisplayNode::printNode(std::set<std::string> valuesSet,
                                     const std::string &prefix) const {

  // First compress the long names a little bit for readability.
  std::string name;
  if (_name.size() > 48) {
    name = _name.substr(0,8) + "..." +
      _name.substr(_name.size() - 40, std::string::npos);

  } else {
    name = _name;
  }

  // Establish the output.
  std::string out;
  if (!prefix.empty()) out = "\n";

  // Display this node.
  out = prefix + "<displayNode:" + name + ">";

  // The lines following need a longer prefix.
  std::string newPrefix = prefix + " | ";

  out += "\n" + newPrefix + "  Type: " + getType();

  // Print the values added, but also add them to the set of values we
  // know from above this position in the display graph.
  out += "\n" + newPrefix + "  Values Added:";
  for (std::list<std::string>::const_iterator it = _valuesAdded.begin();
       it != _valuesAdded.end(); it++) {
    // Print the value added.
    out += "\n" + newPrefix + "    " + *it;

    // Insert it added value into the set from above.
    valuesSet.insert(*it);
  }
  if (_valuesAdded.empty()) out += "\n" + newPrefix + "     <none>";

  // Print the values needed, but also check them against the values already set.
  out += "\n" + newPrefix + "  Values Needed:";
  for (std::list<std::pair<std::string, bool> >::const_iterator it = _valuesNeeded.begin();
       it != _valuesNeeded.end(); it++) {
    out += "\n" + newPrefix + "    " + it->first;
    if (it->second) {
      out += " (required)";
    } else {
      out += " (optional)";
    }

    // If the name is not in the value set, flag it.
    if (valuesSet.find(it->first) == valuesSet.end()) {

      out += " <-- ERROR: this value will not be found.";
    }
  }
  if (_valuesNeeded.empty()) out += "\n" + newPrefix + "     <none>";

  // Recursively print the children nodes.
  for (std::vector<VRDisplayNode*>::const_iterator it = _children.begin();
       it != _children.end(); it++) {
    out += "\n" + (*it)->printNode(valuesSet, newPrefix);
  }

  return out;
}